

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

_Bool cs_support(int query)

{
  undefined1 local_9;
  int query_local;
  
  archs_enable();
  if (query == 0xffff) {
    local_9 = all_arch == 0xff;
  }
  else if ((uint)query < 8) {
    local_9 = (all_arch & 1 << ((byte)query & 0x1f)) != 0;
  }
  else if (query == 0x10000) {
    local_9 = false;
  }
  else if (query == 0x10001) {
    local_9 = false;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

CAPSTONE_EXPORT
bool cs_support(int query)
{
	archs_enable();

	if (query == CS_ARCH_ALL)
		return all_arch == ((1 << CS_ARCH_ARM) | (1 << CS_ARCH_ARM64) |
				(1 << CS_ARCH_MIPS) | (1 << CS_ARCH_X86) |
				(1 << CS_ARCH_PPC) | (1 << CS_ARCH_SPARC) |
				(1 << CS_ARCH_SYSZ) | (1 << CS_ARCH_XCORE));

	if ((unsigned int)query < CS_ARCH_MAX)
		return all_arch & (1 << query);

	if (query == CS_SUPPORT_DIET) {
#ifdef CAPSTONE_DIET
		return true;
#else
		return false;
#endif
	}

	if (query == CS_SUPPORT_X86_REDUCE) {
#if defined(CAPSTONE_HAS_X86) && defined(CAPSTONE_X86_REDUCE)
		return true;
#else
		return false;
#endif
	}

	// unsupported query
	return false;
}